

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O0

double S2::GetCurvature(S2PointLoopSpan loop)

{
  pointer *ppVVar1;
  double dVar2;
  S2PointLoopSpan loop_00;
  bool bVar3;
  size_type sVar4;
  reference pVVar5;
  reference pVVar6;
  reference pVVar7;
  double *pdVar8;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *in_RCX;
  S2PointLoopSpan SVar9;
  double local_d0;
  double local_c8;
  double local_c0;
  double kMaxCurvature;
  double old_sum;
  double angle;
  double compensation;
  double sum;
  int local_90;
  int n;
  int dir;
  int i;
  size_type sStack_80;
  LoopOrder local_70;
  LoopOrder order;
  undefined1 local_38 [8];
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  S2PointLoopSpan loop_local;
  
  SVar9.super_S2PointSpan.ptr_ = (pointer)loop.super_S2PointSpan.len_;
  vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = loop.super_S2PointSpan.ptr_;
  bVar3 = absl::Span<const_Vector3<double>_>::empty
                    ((Span<const_Vector3<double>_> *)
                     &vertices.
                      super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
  if (bVar3) {
    loop_local.super_S2PointSpan.len_ = 0xc01921fb54442d18;
  }
  else {
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_38);
    SVar9.super_S2PointSpan.len_ = (size_type)local_38;
    SVar9 = PruneDegeneracies((S2 *)vertices.
                                    super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,SVar9,in_RCX)
    ;
    vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = SVar9.super_S2PointSpan.ptr_;
    bVar3 = absl::Span<const_Vector3<double>_>::empty
                      ((Span<const_Vector3<double>_> *)
                       &vertices.
                        super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar3) {
      loop_local.super_S2PointSpan.len_ = 0x401921fb54442d18;
    }
    else {
      _dir = vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
      loop_00.super_S2PointSpan.len_ = SVar9.super_S2PointSpan.len_;
      loop_00.super_S2PointSpan.ptr_ =
           vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      sStack_80 = SVar9.super_S2PointSpan.len_;
      local_70 = GetCanonicalLoopOrder(loop_00);
      n = local_70.first;
      local_90 = local_70.dir;
      ppVVar1 = &vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar4 = absl::Span<const_Vector3<double>_>::size((Span<const_Vector3<double>_> *)ppVVar1);
      sum._4_4_ = (int)sVar4;
      pVVar5 = S2PointLoopSpan::operator[]
                         ((S2PointLoopSpan *)ppVVar1,((n + sum._4_4_) - local_90) % sum._4_4_);
      pVVar6 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)ppVVar1,n);
      pVVar7 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)ppVVar1,(n + local_90) % sum._4_4_);
      compensation = TurnAngle(pVVar5,pVVar6,pVVar7);
      angle = 0.0;
      while (sum._4_4_ = sum._4_4_ + -1, 0 < sum._4_4_) {
        n = n + local_90;
        ppVVar1 = &vertices.super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        pVVar5 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)ppVVar1,n - local_90);
        pVVar6 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)ppVVar1,n);
        pVVar7 = S2PointLoopSpan::operator[]((S2PointLoopSpan *)ppVVar1,n + local_90);
        dVar2 = TurnAngle(pVVar5,pVVar6,pVVar7);
        kMaxCurvature = compensation;
        old_sum = angle + dVar2;
        angle = (compensation - (old_sum + compensation)) + old_sum;
        compensation = old_sum + compensation;
      }
      local_c0 = 6.283185307179585;
      compensation = compensation + angle;
      local_c8 = -6.283185307179585;
      local_d0 = (double)local_90 * compensation;
      pdVar8 = std::min<double>(&local_c0,&local_d0);
      pdVar8 = std::max<double>(&local_c8,pdVar8);
      loop_local.super_S2PointSpan.len_ = (size_type)*pdVar8;
    }
    order.first = 1;
    std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::~vector
              ((vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)local_38);
  }
  return (double)loop_local.super_S2PointSpan.len_;
}

Assistant:

double GetCurvature(S2PointLoopSpan loop) {
  // By convention, a loop with no vertices contains all points on the sphere.
  if (loop.empty()) return -2 * M_PI;

  // Remove any degeneracies from the loop.
  vector<S2Point> vertices;
  loop = PruneDegeneracies(loop, &vertices);

  // If the entire loop was degenerate, it's turning angle is defined as 2*Pi.
  if (loop.empty()) return 2 * M_PI;

  // To ensure that we get the same result when the vertex order is rotated,
  // and that the result is negated when the vertex order is reversed, we need
  // to add up the individual turn angles in a consistent order.  (In general,
  // adding up a set of numbers in a different order can change the sum due to
  // rounding errors.)
  //
  // Furthermore, if we just accumulate an ordinary sum then the worst-case
  // error is quadratic in the number of vertices.  (This can happen with
  // spiral shapes, where the partial sum of the turning angles can be linear
  // in the number of vertices.)  To avoid this we use the Kahan summation
  // algorithm (http://en.wikipedia.org/wiki/Kahan_summation_algorithm).
  LoopOrder order = GetCanonicalLoopOrder(loop);
  int i = order.first, dir = order.dir, n = loop.size();
  double sum = S2::TurnAngle(loop[(i + n - dir) % n], loop[i],
                             loop[(i + dir) % n]);
  double compensation = 0;  // Kahan summation algorithm
  while (--n > 0) {
    i += dir;
    double angle = S2::TurnAngle(loop[i - dir], loop[i], loop[i + dir]);
    double old_sum = sum;
    angle += compensation;
    sum += angle;
    compensation = (old_sum - sum) + angle;
  }
  constexpr double kMaxCurvature = 2 * M_PI - 4 * DBL_EPSILON;
  sum += compensation;
  return max(-kMaxCurvature, min(kMaxCurvature, dir * sum));
}